

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomObj.cpp
# Opt level: O1

void __thiscall GeometricObject::~GeometricObject(GeometricObject *this)

{
  Map *pMVar1;
  
  this->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108ba0;
  pMVar1 = this->mapping;
  if (pMVar1 != (Map *)0x0) goto LAB_001041c3;
  while (pMVar1 = (Map *)this->material, pMVar1 != (Map *)0x0) {
    this->material = *(Texture **)(pMVar1 + 8);
LAB_001041c3:
    (**(code **)(*(long *)pMVar1 + 8))();
  }
  return;
}

Assistant:

GeometricObject::~GeometricObject()
{
    Texture *m;

    if(mapping) delete mapping;

    for( m = material; m != 0; m = material )
    {
        material = material->next;
        delete m;
    }

//  if(transform) delete transform;
}